

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_log.c
# Opt level: O0

void zt_log_set_debug_info(char *file,int line,char *func)

{
  zt_log_ctx_ty *pzVar1;
  char *in_RDX;
  int in_ESI;
  char *in_RDI;
  zt_log_ctx_ty *ctx;
  
  pzVar1 = zt_log_get_ctx();
  if (pzVar1 != (zt_log_ctx_ty *)0x0) {
    pzVar1->file = in_RDI;
    pzVar1->line = in_ESI;
    pzVar1->function = in_RDX;
  }
  return;
}

Assistant:

void
zt_log_set_debug_info(const char * file, int line, const char * func) {
    zt_log_ctx_ty   * ctx;

    if ((ctx = zt_log_get_ctx()) == NULL) {
        return;
    }

    ctx->file     = (char*)file;
    ctx->line     = line;
    ctx->function = (char*)func;
}